

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicGLSLMisc::Run(BasicGLSLMisc *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  reference pixels;
  CallLogWrapper *pCVar4;
  Vector<float,_4> local_80;
  char *local_70;
  char *src_fs;
  char *src_vs;
  allocator<tcu::Vector<float,_4>_> local_49;
  Vector<float,_4> local_48;
  undefined1 local_38 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  int kSize;
  BasicGLSLMisc *this_local;
  
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x20;
  tcu::Vector<float,_4>::Vector(&local_48,0.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38,
             0x1000,&local_48,&local_49);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_49);
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_texture);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,this->m_texture);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,0x2801,0x2601);
  pixels = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_38,0);
  glu::CallLogWrapper::glTexImage3D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,0,0x8814,0x20,0x20,4,0,0x1908,0x1406,pixels);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,0);
  src_fs = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  local_70 = 
  "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) coherent volatile restrict uniform image2D g_image_layer0;\nlayout(rgba32f) volatile uniform image2D g_image_layer1;\nvec4 Load(layout(rgba32f) volatile image2D image, ivec2 coord) {\n  return imageLoad(image, coord);\n}\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_layer0, coord, vec4(1.0));\n  memoryBarrier();\n  imageStore(g_image_layer0, coord, vec4(2.0));\n  memoryBarrier();\n  imageStore(g_image_layer0, coord, vec4(0.0, 1.0, 0.0, 1.0));\n  memoryBarrier();\n  o_color = imageLoad(g_image_layer0, coord) + Load(g_image_layer1, coord);\n}"
  ;
  GVar2 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) coherent volatile restrict uniform image2D g_image_layer0;\nlayout(rgba32f) volatile uniform image2D g_image_layer1;\nvec4 Load(layout(rgba32f) volatile image2D image, ivec2 coord) {\n  return imageLoad(image, coord);\n}\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_layer0, coord, vec4(1.0));\n  memoryBarrier();\n  imageStore(g_image_layer0, coord, vec4(2.0));\n  memoryBarrier();\n  imageStore(g_image_layer0, coord, vec4(0.0, 1.0, 0.0, 1.0));\n  memoryBarrier();\n  o_color = imageLoad(g_image_layer0, coord) + Load(g_image_layer1, coord);\n}"
                     ,(bool *)0x0);
  this->m_program = GVar2;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,this->m_texture,0,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,this->m_texture,0,'\0',1,35000,0x8814);
  glu::CallLogWrapper::glClear
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x4000);
  glu::CallLogWrapper::glViewport
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,0x20,0x20);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  pCVar4 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->m_program,"g_image_layer0");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,0);
  pCVar4 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->m_program,"g_image_layer1");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,1);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,5,0,4);
  tcu::Vector<float,_4>::Vector(&local_80,0.0,1.0,0.0,1.0);
  bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&this->super_ShaderImageLoadStoreBase,0,0,0x20,0x20,&local_80);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local = (BasicGLSLMisc *)0x0;
  }
  else {
    this_local = (BasicGLSLMisc *)&DAT_ffffffffffffffff;
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const int		  kSize = 32;
		std::vector<vec4> data(kSize * kSize * 4, vec4(0.0f));

		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, kSize, kSize, 4, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const char* src_fs =
			"#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
			"layout(rgba32f) coherent volatile restrict uniform image2D g_image_layer0;" NL
			"layout(rgba32f) volatile uniform image2D g_image_layer1;" NL
			"vec4 Load(layout(rgba32f) volatile image2D image, ivec2 coord) {" NL "  return imageLoad(image, coord);" NL
			"}" NL "void main() {" NL "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL
			"  imageStore(g_image_layer0, coord, vec4(1.0));" NL "  memoryBarrier();" NL
			"  imageStore(g_image_layer0, coord, vec4(2.0));" NL "  memoryBarrier();" NL
			"  imageStore(g_image_layer0, coord, vec4(0.0, 1.0, 0.0, 1.0));" NL "  memoryBarrier();" NL
			"  o_color = imageLoad(g_image_layer0, coord) + Load(g_image_layer1, coord);" NL "}";
		m_program = BuildProgram(src_vs, NULL, NULL, NULL, src_fs);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture, 0, GL_FALSE, 1, GL_READ_ONLY, GL_RGBA32F);

		glClear(GL_COLOR_BUFFER_BIT);
		glViewport(0, 0, kSize, kSize);

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_image_layer0"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_image_layer1"), 1);

		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}